

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

Matrix<double,_3,_3> *
gl4cts::Math::inverse<3>(Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *matrix)

{
  Vector<double,_3> *pVVar1;
  GLuint c_1;
  ulong uVar2;
  double *extraout_RDX;
  double *extraout_RDX_00;
  double *mat;
  GLuint r;
  ulong uVar3;
  ulong uVar4;
  GLuint c;
  ulong uVar5;
  double dVar6;
  Matrix<double,_3,_3> adjugate;
  Matrix<double,_3,_3> cof;
  double adStack_d8 [3];
  Matrix<double,_3,_3> local_c0;
  Matrix<double,_3,_3> local_78;
  
  tcu::Matrix<double,_3,_3>::Matrix(&local_78);
  mat = extraout_RDX;
  for (uVar5 = 0; uVar5 != 3; uVar5 = uVar5 + 1) {
    for (uVar3 = 0; uVar3 != 3; uVar3 = uVar3 + 1) {
      tcu::Matrix<double,_2,_2>::Matrix((Matrix<double,_2,_2> *)&local_c0);
      pVVar1 = (Vector<double,_3> *)matrix;
      mat = extraout_RDX_00;
      for (uVar2 = 0; uVar2 != 3; uVar2 = uVar2 + 1) {
        if (uVar2 != uVar5) {
          mat = local_c0.m_data.m_data[0].m_data +
                (long)(int)((int)uVar2 - (uint)(uVar5 < uVar2)) * 2;
          for (uVar4 = 0; uVar4 != 3; uVar4 = uVar4 + 1) {
            if (uVar3 != uVar4) {
              mat[(int)((int)uVar4 - (uint)(uVar3 < uVar4))] = pVVar1->m_data[uVar4];
            }
          }
        }
        pVVar1 = pVVar1 + 1;
      }
      dVar6 = local_c0.m_data.m_data[0].m_data[0] * local_c0.m_data.m_data[1].m_data[0] -
              local_c0.m_data.m_data[0].m_data[2] * local_c0.m_data.m_data[0].m_data[1];
      if (((int)uVar5 + (int)uVar3 & 1U) != 0) {
        dVar6 = -dVar6;
      }
      local_78.m_data.m_data[uVar5].m_data[uVar3] = dVar6;
    }
  }
  tcu::transpose<double,3,3>(&local_c0,(tcu *)&local_78,(Matrix<double,_3,_3> *)mat);
  dVar6 = determinant<double>(matrix);
  tcu::operator*(__return_storage_ptr__,&local_c0,1.0 / dVar6);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> inverse(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	const tcu::Matrix<glw::GLdouble, Size, Size> cof	  = cofactors(matrix);
	const tcu::Matrix<glw::GLdouble, Size, Size> adjugate = tcu::transpose(cof);
	const glw::GLdouble det		= determinant(matrix);
	const glw::GLdouble inv_det = 1.0 / det;

	tcu::Matrix<glw::GLdouble, Size, Size> result = adjugate * inv_det;

	return result;
}